

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O3

idx_t duckdb::FindRangeBound<duckdb::LessThan,true>
                (WindowCursor *range_lo,WindowCursor *range_hi,idx_t order_begin,idx_t order_end,
                WindowBoundary range,WindowInputExpression *boundary,idx_t chunk_idx,
                FrameBounds *prev)

{
  PhysicalType PVar1;
  byte bVar2;
  data_t dVar3;
  short sVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  undefined1 auVar11 [12];
  byte bVar12;
  char cVar13;
  bool bVar14;
  short sVar15;
  unsigned_short uVar16;
  uint uVar17;
  int iVar18;
  int64_t ldays;
  reference pvVar19;
  OutOfRangeException *pOVar20;
  unsigned_long uVar21;
  InternalException *this;
  ulong uVar23;
  WindowCursor *pWVar24;
  WindowCursor *pWVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  float fVar31;
  hugeint_t hVar32;
  interval_t iVar33;
  WindowColumnIterator<unsigned_long> WVar34;
  WindowColumnIterator<short> WVar35;
  WindowColumnIterator<unsigned_int> WVar36;
  WindowColumnIterator<signed_char> WVar37;
  WindowColumnIterator<unsigned_short> WVar38;
  WindowColumnIterator<unsigned_char> WVar39;
  WindowColumnIterator<int> WVar40;
  WindowColumnIterator<double> WVar41;
  WindowColumnIterator<long> WVar42;
  WindowColumnIterator<float> WVar43;
  WindowColumnIterator<duckdb::uhugeint_t> WVar44;
  WindowColumnIterator<duckdb::interval_t> WVar45;
  WindowColumnIterator<duckdb::hugeint_t> WVar46;
  WindowColumnIterator<unsigned_long> __last;
  WindowColumnIterator<short> __last_00;
  WindowColumnIterator<unsigned_int> __last_01;
  WindowColumnIterator<signed_char> __last_02;
  WindowColumnIterator<unsigned_short> __last_03;
  WindowColumnIterator<unsigned_char> __last_04;
  WindowColumnIterator<int> __last_05;
  WindowColumnIterator<double> __last_06;
  WindowColumnIterator<long> __last_07;
  WindowColumnIterator<float> __last_08;
  WindowColumnIterator<duckdb::uhugeint_t> __last_09;
  WindowColumnIterator<duckdb::interval_t> __last_10;
  WindowColumnIterator<duckdb::hugeint_t> __last_11;
  OperationCompare<unsigned_char,_duckdb::LessThan> comp;
  uchar val;
  double cur_val;
  _Any_data local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  WindowCursor *local_98;
  WindowCursor *local_90;
  _Any_data local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  interval_t local_68;
  long local_50;
  long local_48;
  uhugeint_t local_40;
  idx_t iVar22;
  
  auVar11 = (undefined1  [12])local_40._4_12_;
  PVar1 = boundary->ptype;
  local_98 = range_hi;
  local_90 = range_lo;
  switch(PVar1) {
  case UINT8:
    pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pWVar24 = local_90;
    pWVar25 = local_98;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    bVar2 = pvVar19->data[chunk_idx];
    local_68.months._0_1_ = bVar2;
    local_78._M_allocated_capacity = 0;
    local_78._8_8_ = 0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      bVar12 = WindowCursor::GetCell<unsigned_char>(local_98,0,order_end - 1);
      pWVar24 = local_90;
      if (bVar12 < bVar2) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b8._M_unused._M_object = &local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      bVar12 = WindowCursor::GetCell<unsigned_char>(local_90,0,order_begin);
      pWVar25 = local_98;
      if (bVar2 < bVar12) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b8._M_unused._M_object = &local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    iVar22 = order_begin;
    if (uVar8 < prev->end) {
      if (uVar8 < order_end && order_begin <= uVar8) {
        bVar12 = WindowCursor::GetCell<unsigned_char>(pWVar24,0,uVar8);
        if ((bVar12 <= bVar2) && (iVar22 = prev->start, bVar2 <= bVar12)) goto LAB_011a8873;
      }
      uVar8 = prev->end;
      if ((uVar8 < order_end && order_begin < uVar8) &&
         (bVar12 = WindowCursor::GetCell<unsigned_char>(pWVar25,0,uVar8 - 1), bVar2 <= bVar12)) {
        order_end = prev->end + 1;
      }
    }
    ::std::function<bool_(unsigned_char,_unsigned_char)>::function
              ((function<bool_(unsigned_char,_unsigned_char)> *)&local_b8,
               (function<bool_(unsigned_char,_unsigned_char)> *)&local_88);
    WVar39.pos = iVar22;
    WVar39.coll = pWVar24;
    __last_04.pos = order_end;
    __last_04.coll = pWVar25;
    WVar39 = ::std::
             lower_bound<duckdb::WindowColumnIterator<unsigned_char>,unsigned_char,duckdb::OperationCompare<unsigned_char,duckdb::LessThan>>
                       (WVar39,__last_04,(uchar *)&local_68,
                        (OperationCompare<unsigned_char,_duckdb::LessThan> *)&local_b8);
    iVar22 = WVar39.pos;
    if ((code *)local_a8._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_a8._M_allocated_capacity)(&local_b8,&local_b8,3);
    }
LAB_011a8873:
    if ((code *)local_78._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
    }
    return iVar22;
  case INT8:
    pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pWVar24 = local_90;
    pWVar25 = local_98;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    dVar3 = pvVar19->data[chunk_idx];
    local_68.months._0_1_ = dVar3;
    local_78._M_allocated_capacity = 0;
    local_78._8_8_ = 0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      cVar13 = WindowCursor::GetCell<signed_char>(local_98,0,order_end - 1);
      pWVar24 = local_90;
      if (cVar13 < (char)dVar3) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b8._M_unused._M_object = &local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      cVar13 = WindowCursor::GetCell<signed_char>(local_90,0,order_begin);
      pWVar25 = local_98;
      if ((char)dVar3 < cVar13) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b8._M_unused._M_object = &local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    iVar22 = order_begin;
    if (uVar8 < prev->end) {
      if (((uVar8 < order_end && order_begin <= uVar8) &&
          (cVar13 = WindowCursor::GetCell<signed_char>(pWVar24,0,uVar8), cVar13 <= (char)dVar3)) &&
         (iVar22 = prev->start, (char)dVar3 <= cVar13)) goto LAB_011a845e;
      uVar8 = prev->end;
      if ((uVar8 < order_end && order_begin < uVar8) &&
         (cVar13 = WindowCursor::GetCell<signed_char>(pWVar25,0,uVar8 - 1), (char)dVar3 <= cVar13))
      {
        order_end = prev->end + 1;
      }
    }
    ::std::function<bool_(signed_char,_signed_char)>::function
              ((function<bool_(signed_char,_signed_char)> *)&local_b8,
               (function<bool_(signed_char,_signed_char)> *)&local_88);
    WVar37.pos = iVar22;
    WVar37.coll = pWVar24;
    __last_02.pos = order_end;
    __last_02.coll = pWVar25;
    WVar37 = ::std::
             lower_bound<duckdb::WindowColumnIterator<signed_char>,signed_char,duckdb::OperationCompare<signed_char,duckdb::LessThan>>
                       (WVar37,__last_02,(char *)&local_68,
                        (OperationCompare<signed_char,_duckdb::LessThan> *)&local_b8);
    iVar22 = WVar37.pos;
    if ((code *)local_a8._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_a8._M_allocated_capacity)(&local_b8,&local_b8,3);
    }
LAB_011a845e:
    if ((code *)local_78._M_allocated_capacity == (code *)0x0) {
      return iVar22;
    }
    (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
    return iVar22;
  case UINT16:
    pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pWVar24 = local_90;
    pWVar25 = local_98;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    uVar5 = *(ushort *)(pvVar19->data + chunk_idx * 2);
    local_68.months._0_2_ = uVar5;
    local_78._M_allocated_capacity = 0;
    local_78._8_8_ = 0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      uVar16 = WindowCursor::GetCell<unsigned_short>(local_98,0,order_end - 1);
      pWVar24 = local_90;
      if (uVar16 < uVar5) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b8._M_unused._M_object = &local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar16 = WindowCursor::GetCell<unsigned_short>(local_90,0,order_begin);
      pWVar25 = local_98;
      if (uVar5 < uVar16) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b8._M_unused._M_object = &local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    iVar22 = order_begin;
    if (uVar8 < prev->end) {
      if (uVar8 < order_end && order_begin <= uVar8) {
        uVar16 = WindowCursor::GetCell<unsigned_short>(pWVar24,0,uVar8);
        if ((uVar16 <= uVar5) && (iVar22 = prev->start, uVar5 <= uVar16)) goto LAB_011a8774;
      }
      uVar8 = prev->end;
      if ((uVar8 < order_end && order_begin < uVar8) &&
         (uVar16 = WindowCursor::GetCell<unsigned_short>(pWVar25,0,uVar8 - 1), uVar5 <= uVar16)) {
        order_end = prev->end + 1;
      }
    }
    ::std::function<bool_(unsigned_short,_unsigned_short)>::function
              ((function<bool_(unsigned_short,_unsigned_short)> *)&local_b8,
               (function<bool_(unsigned_short,_unsigned_short)> *)&local_88);
    WVar38.pos = iVar22;
    WVar38.coll = pWVar24;
    __last_03.pos = order_end;
    __last_03.coll = pWVar25;
    WVar38 = ::std::
             lower_bound<duckdb::WindowColumnIterator<unsigned_short>,unsigned_short,duckdb::OperationCompare<unsigned_short,duckdb::LessThan>>
                       (WVar38,__last_03,(unsigned_short *)&local_68,
                        (OperationCompare<unsigned_short,_duckdb::LessThan> *)&local_b8);
    iVar22 = WVar38.pos;
    if ((code *)local_a8._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_a8._M_allocated_capacity)(&local_b8,&local_b8,3);
    }
LAB_011a8774:
    if ((code *)local_78._M_allocated_capacity == (code *)0x0) {
      return iVar22;
    }
    (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
    return iVar22;
  case INT16:
    pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pWVar24 = local_90;
    pWVar25 = local_98;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    sVar4 = *(short *)(pvVar19->data + chunk_idx * 2);
    local_68.months._0_2_ = sVar4;
    local_78._M_allocated_capacity = 0;
    local_78._8_8_ = 0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      sVar15 = WindowCursor::GetCell<short>(local_98,0,order_end - 1);
      pWVar24 = local_90;
      if (sVar15 < sVar4) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b8._M_unused._M_object = &local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      sVar15 = WindowCursor::GetCell<short>(local_90,0,order_begin);
      pWVar25 = local_98;
      if (sVar4 < sVar15) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b8._M_unused._M_object = &local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    iVar22 = order_begin;
    if (uVar8 < prev->end) {
      if (((uVar8 < order_end && order_begin <= uVar8) &&
          (sVar15 = WindowCursor::GetCell<short>(pWVar24,0,uVar8), sVar15 <= sVar4)) &&
         (iVar22 = prev->start, sVar4 <= sVar15)) goto LAB_011a8260;
      uVar8 = prev->end;
      if ((uVar8 < order_end && order_begin < uVar8) &&
         (sVar15 = WindowCursor::GetCell<short>(pWVar25,0,uVar8 - 1), sVar4 <= sVar15)) {
        order_end = prev->end + 1;
      }
    }
    ::std::function<bool_(short,_short)>::function
              ((function<bool_(short,_short)> *)&local_b8,(function<bool_(short,_short)> *)&local_88
              );
    WVar35.pos = iVar22;
    WVar35.coll = pWVar24;
    __last_00.pos = order_end;
    __last_00.coll = pWVar25;
    WVar35 = ::std::
             lower_bound<duckdb::WindowColumnIterator<short>,short,duckdb::OperationCompare<short,duckdb::LessThan>>
                       (WVar35,__last_00,(short *)&local_68,
                        (OperationCompare<short,_duckdb::LessThan> *)&local_b8);
    iVar22 = WVar35.pos;
    if ((code *)local_a8._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_a8._M_allocated_capacity)(&local_b8,&local_b8,3);
    }
LAB_011a8260:
    if ((code *)local_78._M_allocated_capacity == (code *)0x0) {
      return iVar22;
    }
    (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
    return iVar22;
  case UINT32:
    pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pWVar24 = local_90;
    pWVar25 = local_98;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    uVar6 = *(uint *)(pvVar19->data + chunk_idx * 4);
    local_68.months = uVar6;
    local_78._M_allocated_capacity = 0;
    local_78._8_8_ = 0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      uVar17 = WindowCursor::GetCell<unsigned_int>(local_98,0,order_end - 1);
      pWVar24 = local_90;
      if (uVar17 < uVar6) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b8._M_unused._M_object = &local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar17 = WindowCursor::GetCell<unsigned_int>(local_90,0,order_begin);
      pWVar25 = local_98;
      if (uVar6 < uVar17) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b8._M_unused._M_object = &local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    iVar22 = order_begin;
    if (uVar8 < prev->end) {
      if (uVar8 < order_end && order_begin <= uVar8) {
        uVar17 = WindowCursor::GetCell<unsigned_int>(pWVar24,0,uVar8);
        if ((uVar17 <= uVar6) && (iVar22 = prev->start, uVar6 <= uVar17)) goto LAB_011a835f;
      }
      uVar8 = prev->end;
      if ((uVar8 < order_end && order_begin < uVar8) &&
         (uVar17 = WindowCursor::GetCell<unsigned_int>(pWVar25,0,uVar8 - 1), uVar6 <= uVar17)) {
        order_end = prev->end + 1;
      }
    }
    ::std::function<bool_(unsigned_int,_unsigned_int)>::function
              ((function<bool_(unsigned_int,_unsigned_int)> *)&local_b8,
               (function<bool_(unsigned_int,_unsigned_int)> *)&local_88);
    WVar36.pos = iVar22;
    WVar36.coll = pWVar24;
    __last_01.pos = order_end;
    __last_01.coll = pWVar25;
    WVar36 = ::std::
             lower_bound<duckdb::WindowColumnIterator<unsigned_int>,unsigned_int,duckdb::OperationCompare<unsigned_int,duckdb::LessThan>>
                       (WVar36,__last_01,(uint *)&local_68,
                        (OperationCompare<unsigned_int,_duckdb::LessThan> *)&local_b8);
    iVar22 = WVar36.pos;
    if ((code *)local_a8._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_a8._M_allocated_capacity)(&local_b8,&local_b8,3);
    }
LAB_011a835f:
    if ((code *)local_78._M_allocated_capacity == (code *)0x0) {
      return iVar22;
    }
    (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
    return iVar22;
  case INT32:
    pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pWVar24 = local_90;
    pWVar25 = local_98;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    iVar7 = *(int *)(pvVar19->data + chunk_idx * 4);
    local_68.months = iVar7;
    local_78._M_allocated_capacity = 0;
    local_78._8_8_ = 0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      iVar18 = WindowCursor::GetCell<int>(local_98,0,order_end - 1);
      pWVar24 = local_90;
      if (iVar18 < iVar7) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b8._M_unused._M_object = &local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      iVar18 = WindowCursor::GetCell<int>(local_90,0,order_begin);
      pWVar25 = local_98;
      if (iVar7 < iVar18) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b8._M_unused._M_object = &local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    iVar22 = order_begin;
    if (uVar8 < prev->end) {
      if (((uVar8 < order_end && order_begin <= uVar8) &&
          (iVar18 = WindowCursor::GetCell<int>(pWVar24,0,uVar8), iVar18 <= iVar7)) &&
         (iVar22 = prev->start, iVar7 <= iVar18)) goto LAB_011a8972;
      uVar8 = prev->end;
      if ((uVar8 < order_end && order_begin < uVar8) &&
         (iVar18 = WindowCursor::GetCell<int>(pWVar25,0,uVar8 - 1), iVar7 <= iVar18)) {
        order_end = prev->end + 1;
      }
    }
    ::std::function<bool_(int,_int)>::function
              ((function<bool_(int,_int)> *)&local_b8,(function<bool_(int,_int)> *)&local_88);
    WVar40.pos = iVar22;
    WVar40.coll = pWVar24;
    __last_05.pos = order_end;
    __last_05.coll = pWVar25;
    WVar40 = ::std::
             lower_bound<duckdb::WindowColumnIterator<int>,int,duckdb::OperationCompare<int,duckdb::LessThan>>
                       (WVar40,__last_05,&local_68.months,
                        (OperationCompare<int,_duckdb::LessThan> *)&local_b8);
    iVar22 = WVar40.pos;
    if ((code *)local_a8._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_a8._M_allocated_capacity)(&local_b8,&local_b8,3);
    }
LAB_011a8972:
    if ((code *)local_78._M_allocated_capacity == (code *)0x0) {
      return iVar22;
    }
    (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
    return iVar22;
  case UINT64:
    pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pWVar24 = local_90;
    pWVar25 = local_98;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    uVar8 = *(ulong *)(pvVar19->data + chunk_idx * 8);
    local_78._M_allocated_capacity = 0;
    local_78._8_8_ = 0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    local_68._0_8_ = uVar8;
    if (range == EXPR_PRECEDING_RANGE) {
      uVar21 = WindowCursor::GetCell<unsigned_long>(local_98,0,order_end - 1);
      pWVar24 = local_90;
      if (uVar21 < uVar8) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b8._M_unused._M_object = &local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      uVar21 = WindowCursor::GetCell<unsigned_long>(local_90,0,order_begin);
      pWVar25 = local_98;
      if (uVar8 < uVar21) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b8._M_unused._M_object = &local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar23 = prev->start;
    iVar22 = order_begin;
    if (uVar23 < prev->end) {
      if (uVar23 < order_end && order_begin <= uVar23) {
        uVar21 = WindowCursor::GetCell<unsigned_long>(pWVar24,0,uVar23);
        if ((uVar21 <= uVar8) && (iVar22 = prev->start, uVar8 <= uVar21)) goto LAB_011a815e;
      }
      uVar23 = prev->end;
      if ((uVar23 < order_end && order_begin < uVar23) &&
         (uVar21 = WindowCursor::GetCell<unsigned_long>(pWVar25,0,uVar23 - 1), uVar8 <= uVar21)) {
        order_end = prev->end + 1;
      }
    }
    ::std::function<bool_(unsigned_long,_unsigned_long)>::function
              ((function<bool_(unsigned_long,_unsigned_long)> *)&local_b8,
               (function<bool_(unsigned_long,_unsigned_long)> *)&local_88);
    WVar34.pos = iVar22;
    WVar34.coll = pWVar24;
    __last.pos = order_end;
    __last.coll = pWVar25;
    WVar34 = ::std::
             lower_bound<duckdb::WindowColumnIterator<unsigned_long>,unsigned_long,duckdb::OperationCompare<unsigned_long,duckdb::LessThan>>
                       (WVar34,__last,(unsigned_long *)&local_68,
                        (OperationCompare<unsigned_long,_duckdb::LessThan> *)&local_b8);
    iVar22 = WVar34.pos;
    if ((code *)local_a8._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_a8._M_allocated_capacity)(&local_b8,&local_b8,3);
    }
LAB_011a815e:
    if ((code *)local_78._M_allocated_capacity == (code *)0x0) {
      return iVar22;
    }
    (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
    return iVar22;
  case INT64:
    pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pWVar24 = local_90;
    pWVar25 = local_98;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    lVar9 = *(long *)(pvVar19->data + chunk_idx * 8);
    local_78._M_allocated_capacity = 0;
    local_78._8_8_ = 0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    local_68._0_8_ = lVar9;
    if (range == EXPR_PRECEDING_RANGE) {
      lVar26 = WindowCursor::GetCell<long>(local_98,0,order_end - 1);
      pWVar24 = local_90;
      if (lVar26 < lVar9) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b8._M_unused._M_object = &local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      lVar26 = WindowCursor::GetCell<long>(local_90,0,order_begin);
      pWVar25 = local_98;
      if (lVar9 < lVar26) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b8._M_unused._M_object = &local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    iVar22 = order_begin;
    if (uVar8 < prev->end) {
      if (((uVar8 < order_end && order_begin <= uVar8) &&
          (lVar26 = WindowCursor::GetCell<long>(pWVar24,0,uVar8), lVar26 <= lVar9)) &&
         (iVar22 = prev->start, lVar9 <= lVar26)) goto LAB_011a8bcc;
      uVar8 = prev->end;
      if ((uVar8 < order_end && order_begin < uVar8) &&
         (lVar26 = WindowCursor::GetCell<long>(pWVar25,0,uVar8 - 1), lVar9 <= lVar26)) {
        order_end = prev->end + 1;
      }
    }
    ::std::function<bool_(long,_long)>::function
              ((function<bool_(long,_long)> *)&local_b8,(function<bool_(long,_long)> *)&local_88);
    WVar42.pos = iVar22;
    WVar42.coll = pWVar24;
    __last_07.pos = order_end;
    __last_07.coll = pWVar25;
    WVar42 = ::std::
             lower_bound<duckdb::WindowColumnIterator<long>,long,duckdb::OperationCompare<long,duckdb::LessThan>>
                       (WVar42,__last_07,(long *)&local_68,
                        (OperationCompare<long,_duckdb::LessThan> *)&local_b8);
    iVar22 = WVar42.pos;
    if ((code *)local_a8._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_a8._M_allocated_capacity)(&local_b8,&local_b8,3);
    }
LAB_011a8bcc:
    if ((code *)local_78._M_allocated_capacity == (code *)0x0) {
      return iVar22;
    }
    (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
    return iVar22;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
switchD_011a74d9_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_88._M_unused._M_object = &local_78;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"Unsupported column type for RANGE","");
    InternalException::InternalException(this,(string *)&local_88);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    local_40._4_12_ = auVar11;
    pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pWVar24 = local_90;
    pWVar25 = local_98;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_68.months = *(int32_t *)(pvVar19->data + chunk_idx * 4);
    local_78._M_allocated_capacity = 0;
    local_78._8_8_ = 0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      local_40.lower._0_4_ = WindowCursor::GetCell<float>(local_98,0,order_end - 1);
      pWVar24 = local_90;
      bVar14 = GreaterThan::Operation<float>((float *)&local_68,(float *)&local_40);
      if (bVar14) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b8._M_unused._M_object = &local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      local_40.lower._0_4_ = WindowCursor::GetCell<float>(local_90,0,order_begin);
      pWVar25 = local_98;
      bVar14 = GreaterThan::Operation<float>((float *)&local_40,(float *)&local_68);
      if (bVar14) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b8._M_unused._M_object = &local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar23 = prev->end;
    iVar22 = order_begin;
    if (uVar8 < uVar23) {
      if (uVar8 < order_end && order_begin <= uVar8) {
        fVar31 = WindowCursor::GetCell<float>(pWVar24,0,uVar8);
        local_b8._0_4_ = fVar31;
        bVar14 = GreaterThan::Operation<float>((float *)&local_b8,(float *)&local_68);
        if (!bVar14) {
          bVar14 = GreaterThan::Operation<float>((float *)&local_68,(float *)&local_b8);
          iVar22 = prev->start;
          if (!bVar14) goto LAB_011a8d27;
        }
        uVar23 = prev->end;
      }
      if (uVar23 < order_end && order_begin < uVar23) {
        fVar31 = WindowCursor::GetCell<float>(pWVar25,0,uVar23 - 1);
        local_b8._0_4_ = fVar31;
        bVar14 = GreaterThan::Operation<float>((float *)&local_68,(float *)&local_b8);
        if (!bVar14) {
          order_end = prev->end + 1;
        }
      }
    }
    ::std::function<bool_(float,_float)>::function
              ((function<bool_(float,_float)> *)&local_b8,(function<bool_(float,_float)> *)&local_88
              );
    WVar43.pos = iVar22;
    WVar43.coll = pWVar24;
    __last_08.pos = order_end;
    __last_08.coll = pWVar25;
    WVar43 = ::std::
             lower_bound<duckdb::WindowColumnIterator<float>,float,duckdb::OperationCompare<float,duckdb::LessThan>>
                       (WVar43,__last_08,(float *)&local_68,
                        (OperationCompare<float,_duckdb::LessThan> *)&local_b8);
    iVar22 = WVar43.pos;
    if ((code *)local_a8._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_a8._M_allocated_capacity)(&local_b8,&local_b8,3);
    }
LAB_011a8d27:
    if ((code *)local_78._M_allocated_capacity == (code *)0x0) {
      return iVar22;
    }
    (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
    return iVar22;
  case DOUBLE:
    pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pWVar24 = local_90;
    pWVar25 = local_98;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_68._0_8_ = *(undefined8 *)(pvVar19->data + chunk_idx * 8);
    local_78._M_allocated_capacity = 0;
    local_78._8_8_ = 0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      local_40.lower = (uint64_t)WindowCursor::GetCell<double>(local_98,0,order_end - 1);
      pWVar24 = local_90;
      bVar14 = GreaterThan::Operation<double>((double *)&local_68,(double *)&local_40);
      if (bVar14) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b8._M_unused._M_object = &local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      local_40.lower = (uint64_t)WindowCursor::GetCell<double>(local_90,0,order_begin);
      pWVar25 = local_98;
      bVar14 = GreaterThan::Operation<double>((double *)&local_40,(double *)&local_68);
      if (bVar14) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b8._M_unused._M_object = &local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar23 = prev->end;
    iVar22 = order_begin;
    if (uVar8 < uVar23) {
      if (uVar8 < order_end && order_begin <= uVar8) {
        local_b8._M_unused._0_8_ = (undefined8)WindowCursor::GetCell<double>(pWVar24,0,uVar8);
        bVar14 = GreaterThan::Operation<double>((double *)&local_b8,(double *)&local_68);
        if (!bVar14) {
          bVar14 = GreaterThan::Operation<double>((double *)&local_68,(double *)&local_b8);
          iVar22 = prev->start;
          if (!bVar14) goto LAB_011a8acd;
        }
        uVar23 = prev->end;
      }
      if (uVar23 < order_end && order_begin < uVar23) {
        dVar10 = WindowCursor::GetCell<double>(pWVar25,0,uVar23 - 1);
        local_b8._M_unused._M_object = (void *)dVar10;
        bVar14 = GreaterThan::Operation<double>((double *)&local_68,(double *)&local_b8);
        if (!bVar14) {
          order_end = prev->end + 1;
        }
      }
    }
    ::std::function<bool_(double,_double)>::function
              ((function<bool_(double,_double)> *)&local_b8,
               (function<bool_(double,_double)> *)&local_88);
    WVar41.pos = iVar22;
    WVar41.coll = pWVar24;
    __last_06.pos = order_end;
    __last_06.coll = pWVar25;
    WVar41 = ::std::
             lower_bound<duckdb::WindowColumnIterator<double>,double,duckdb::OperationCompare<double,duckdb::LessThan>>
                       (WVar41,__last_06,(double *)&local_68,
                        (OperationCompare<double,_duckdb::LessThan> *)&local_b8);
    iVar22 = WVar41.pos;
    if ((code *)local_a8._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_a8._M_allocated_capacity)(&local_b8,&local_b8,3);
    }
LAB_011a8acd:
    if ((code *)local_78._M_allocated_capacity == (code *)0x0) {
      return iVar22;
    }
    (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
    return iVar22;
  case INTERVAL:
    break;
  default:
    if (PVar1 != UINT128) {
      if (PVar1 != INT128) goto switchD_011a74d9_caseD_a;
      pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
      pWVar25 = local_90;
      if (boundary->scalar != false) {
        chunk_idx = 0;
      }
      uVar8 = *(ulong *)(pvVar19->data + chunk_idx * 0x10);
      lVar9 = *(long *)(pvVar19->data + chunk_idx * 0x10 + 8);
      local_78._M_allocated_capacity = 0;
      local_78._8_8_ = 0;
      local_88._M_unused._M_object = (void *)0x0;
      local_88._8_8_ = 0;
      local_68._0_8_ = uVar8;
      local_68.micros = lVar9;
      if (range == EXPR_PRECEDING_RANGE) {
        hVar32 = WindowCursor::GetCell<duckdb::hugeint_t>(local_98,0,order_end - 1);
        if ((hVar32.upper < lVar9) ||
           (pWVar25 = local_90, hVar32.lower < uVar8 && lVar9 == hVar32.upper)) {
          pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_b8._M_unused._M_object = &local_a8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,"Invalid RANGE PRECEDING value","");
          OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
          __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      else {
        hVar32 = WindowCursor::GetCell<duckdb::hugeint_t>(local_90,0,order_begin);
        if ((lVar9 < hVar32.upper) || (uVar8 < hVar32.lower && hVar32.upper == lVar9)) {
          pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_b8._M_unused._M_object = &local_a8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,"Invalid RANGE FOLLOWING value","");
          OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
          __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      uVar23 = prev->start;
      iVar22 = order_begin;
      if (uVar23 < prev->end) {
        if (uVar23 < order_end && order_begin <= uVar23) {
          hVar32 = WindowCursor::GetCell<duckdb::hugeint_t>(pWVar25,0,uVar23);
          lVar26 = hVar32.upper;
          if ((lVar26 <= lVar9) && (hVar32.lower <= uVar8 || lVar26 != lVar9)) {
            iVar22 = prev->start;
            if ((lVar9 <= lVar26) && (uVar8 <= hVar32.lower || lVar26 != lVar9)) goto LAB_011a91c6;
          }
        }
        uVar23 = prev->end;
        if (uVar23 < order_end && order_begin < uVar23) {
          hVar32 = WindowCursor::GetCell<duckdb::hugeint_t>(local_98,0,uVar23 - 1);
          if ((lVar9 <= hVar32.upper) && (uVar8 <= hVar32.lower || lVar9 != hVar32.upper)) {
            order_end = prev->end + 1;
          }
        }
      }
      pWVar24 = local_98;
      ::std::function<bool_(duckdb::hugeint_t,_duckdb::hugeint_t)>::function
                ((function<bool_(duckdb::hugeint_t,_duckdb::hugeint_t)> *)&local_b8,
                 (function<bool_(duckdb::hugeint_t,_duckdb::hugeint_t)> *)&local_88);
      WVar46.pos = iVar22;
      WVar46.coll = pWVar25;
      __last_11.pos = order_end;
      __last_11.coll = pWVar24;
      WVar46 = ::std::
               lower_bound<duckdb::WindowColumnIterator<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::OperationCompare<duckdb::hugeint_t,duckdb::LessThan>>
                         (WVar46,__last_11,(hugeint_t *)&local_68,
                          (OperationCompare<duckdb::hugeint_t,_duckdb::LessThan> *)&local_b8);
      iVar22 = WVar46.pos;
      if ((code *)local_a8._M_allocated_capacity != (code *)0x0) {
        (*(code *)local_a8._M_allocated_capacity)(&local_b8,&local_b8,3);
      }
LAB_011a91c6:
      if ((code *)local_78._M_allocated_capacity == (code *)0x0) {
        return iVar22;
      }
      (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
      return iVar22;
    }
    pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
    pWVar24 = local_90;
    pWVar25 = local_98;
    if (boundary->scalar != false) {
      chunk_idx = 0;
    }
    local_68._0_8_ = *(undefined8 *)(pvVar19->data + chunk_idx * 0x10);
    local_68.micros = *(int64_t *)(pvVar19->data + chunk_idx * 0x10 + 8);
    local_78._M_allocated_capacity = 0;
    local_78._8_8_ = 0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    if (range == EXPR_PRECEDING_RANGE) {
      local_40 = WindowCursor::GetCell<duckdb::uhugeint_t>(local_98,0,order_end - 1);
      pWVar24 = local_90;
      bVar14 = uhugeint_t::operator>((uhugeint_t *)&local_68,&local_40);
      if (bVar14) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b8._M_unused._M_object = &local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Invalid RANGE PRECEDING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      local_40 = WindowCursor::GetCell<duckdb::uhugeint_t>(local_90,0,order_begin);
      pWVar25 = local_98;
      bVar14 = uhugeint_t::operator>(&local_40,(uhugeint_t *)&local_68);
      if (bVar14) {
        pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_b8._M_unused._M_object = &local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Invalid RANGE FOLLOWING value","");
        OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
        __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar8 = prev->start;
    uVar23 = prev->end;
    iVar22 = order_begin;
    if (uVar8 < uVar23) {
      if (uVar8 < order_end && order_begin <= uVar8) {
        local_b8 = (_Any_data)WindowCursor::GetCell<duckdb::uhugeint_t>(pWVar24,0,uVar8);
        bVar14 = uhugeint_t::operator>((uhugeint_t *)&local_b8,(uhugeint_t *)&local_68);
        if (!bVar14) {
          bVar14 = uhugeint_t::operator>((uhugeint_t *)&local_68,(uhugeint_t *)&local_b8);
          iVar22 = prev->start;
          if (!bVar14) goto LAB_011a8e8b;
        }
        uVar23 = prev->end;
      }
      if (uVar23 < order_end && order_begin < uVar23) {
        local_b8 = (_Any_data)WindowCursor::GetCell<duckdb::uhugeint_t>(pWVar25,0,uVar23 - 1);
        bVar14 = uhugeint_t::operator>((uhugeint_t *)&local_68,(uhugeint_t *)&local_b8);
        if (!bVar14) {
          order_end = prev->end + 1;
        }
      }
    }
    ::std::function<bool_(duckdb::uhugeint_t,_duckdb::uhugeint_t)>::function
              ((function<bool_(duckdb::uhugeint_t,_duckdb::uhugeint_t)> *)&local_b8,
               (function<bool_(duckdb::uhugeint_t,_duckdb::uhugeint_t)> *)&local_88);
    WVar44.pos = iVar22;
    WVar44.coll = pWVar24;
    __last_09.pos = order_end;
    __last_09.coll = pWVar25;
    WVar44 = ::std::
             lower_bound<duckdb::WindowColumnIterator<duckdb::uhugeint_t>,duckdb::uhugeint_t,duckdb::OperationCompare<duckdb::uhugeint_t,duckdb::LessThan>>
                       (WVar44,__last_09,(uhugeint_t *)&local_68,
                        (OperationCompare<duckdb::uhugeint_t,_duckdb::LessThan> *)&local_b8);
    iVar22 = WVar44.pos;
    if ((code *)local_a8._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_a8._M_allocated_capacity)(&local_b8,&local_b8,3);
    }
LAB_011a8e8b:
    if ((code *)local_78._M_allocated_capacity == (code *)0x0) {
      return iVar22;
    }
    (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
    return iVar22;
  }
  local_48 = -86400000000;
  pvVar19 = vector<duckdb::Vector,_true>::operator[](&boundary->chunk->data,boundary->col_idx);
  if (boundary->scalar != false) {
    chunk_idx = 0;
  }
  local_68._0_8_ = *(undefined8 *)(pvVar19->data + chunk_idx * 0x10);
  lVar9 = *(long *)(pvVar19->data + chunk_idx * 0x10 + 8);
  local_78._M_allocated_capacity = 0;
  local_78._8_8_ = 0;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_68.micros = lVar9;
  local_50 = local_68._0_8_;
  if (range == EXPR_PRECEDING_RANGE) {
    iVar33 = WindowCursor::GetCell<duckdb::interval_t>(local_98,0,order_end - 1);
    lVar26 = (local_50 >> 0x20) + lVar9 / 86400000000;
    lVar29 = lVar26 % 0x1e;
    lVar30 = (long)(int)local_50 + lVar26 / 0x1e;
    lVar27 = (iVar33._0_8_ >> 0x20) + iVar33.micros / 86400000000;
    lVar26 = lVar27 % 0x1e;
    lVar27 = (long)iVar33.months + lVar27 / 0x1e;
    if ((lVar27 < lVar30) ||
       ((lVar27 <= lVar30 &&
        ((lVar26 < lVar29 ||
         ((lVar26 <= lVar29 && (iVar33.micros % 86400000000 < lVar9 % 86400000000)))))))) {
      pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_b8._M_unused._M_object = &local_a8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"Invalid RANGE PRECEDING value","");
      OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
      __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    iVar33 = WindowCursor::GetCell<duckdb::interval_t>(local_90,0,order_begin);
    lVar26 = (iVar33._0_8_ >> 0x20) + iVar33.micros / 86400000000;
    lVar29 = lVar26 % 0x1e;
    lVar30 = (long)iVar33.months + lVar26 / 0x1e;
    lVar27 = (local_50 >> 0x20) + lVar9 / 86400000000;
    lVar26 = lVar27 % 0x1e;
    lVar27 = (long)(int)local_50 + lVar27 / 0x1e;
    if ((lVar27 < lVar30) ||
       ((lVar27 <= lVar30 &&
        ((lVar26 < lVar29 ||
         ((lVar26 <= lVar29 && (lVar9 % 86400000000 < iVar33.micros % 86400000000)))))))) {
      pOVar20 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_b8._M_unused._M_object = &local_a8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"Invalid RANGE FOLLOWING value","");
      OutOfRangeException::OutOfRangeException(pOVar20,(string *)&local_b8);
      __cxa_throw(pOVar20,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  uVar8 = prev->start;
  if (uVar8 < prev->end) {
    iVar22 = order_begin;
    if (uVar8 < order_end && order_begin <= uVar8) {
      iVar33 = WindowCursor::GetCell<duckdb::interval_t>(local_90,0,uVar8);
      lVar26 = (iVar33._0_8_ >> 0x20) + iVar33.micros / 86400000000;
      lVar30 = iVar33.micros % 86400000000;
      lVar29 = lVar26 % 0x1e;
      lVar28 = (long)iVar33.months + lVar26 / 0x1e;
      lVar27 = (local_50 >> 0x20) + lVar9 / 86400000000;
      lVar26 = lVar27 % 0x1e;
      lVar27 = (long)(int)local_50 + lVar27 / 0x1e;
      if (lVar28 <= lVar27) {
        if (lVar27 <= lVar28) {
          if ((lVar26 < lVar29) || ((lVar26 <= lVar29 && (lVar9 % 86400000000 < lVar30))))
          goto LAB_011a8fa3;
          if ((lVar26 <= lVar29) && (lVar9 % 86400000000 <= lVar30)) {
            iVar22 = prev->start;
            goto LAB_011a910c;
          }
        }
        iVar22 = prev->start;
      }
    }
LAB_011a8fa3:
    uVar8 = prev->end;
    bVar14 = order_begin < uVar8;
    order_begin = iVar22;
    if (uVar8 < order_end && bVar14) {
      iVar33 = WindowCursor::GetCell<duckdb::interval_t>(local_98,0,uVar8 - 1);
      lVar26 = (local_50 >> 0x20) + lVar9 / 86400000000;
      lVar29 = lVar26 % 0x1e;
      lVar30 = (long)(int)local_50 + lVar26 / 0x1e;
      lVar26 = iVar33.micros / 86400000000;
      local_48 = local_48 * lVar26;
      lVar26 = (iVar33._0_8_ >> 0x20) + lVar26;
      lVar27 = lVar26 % 0x1e;
      lVar26 = (long)iVar33.months + lVar26 / 0x1e;
      if ((lVar30 <= lVar26) &&
         ((lVar30 < lVar26 ||
          ((lVar29 <= lVar27 &&
           ((lVar29 < lVar27 || (lVar9 % 86400000000 <= local_48 + iVar33.micros)))))))) {
        order_end = prev->end + 1;
      }
    }
  }
  ::std::function<bool_(duckdb::interval_t,_duckdb::interval_t)>::function
            ((function<bool_(duckdb::interval_t,_duckdb::interval_t)> *)&local_b8,
             (function<bool_(duckdb::interval_t,_duckdb::interval_t)> *)&local_88);
  WVar45.pos = order_begin;
  WVar45.coll = local_90;
  __last_10.pos = order_end;
  __last_10.coll = local_98;
  WVar45 = ::std::
           lower_bound<duckdb::WindowColumnIterator<duckdb::interval_t>,duckdb::interval_t,duckdb::OperationCompare<duckdb::interval_t,duckdb::LessThan>>
                     (WVar45,__last_10,&local_68,
                      (OperationCompare<duckdb::interval_t,_duckdb::LessThan> *)&local_b8);
  iVar22 = WVar45.pos;
  if ((code *)local_a8._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_a8._M_allocated_capacity)(&local_b8,&local_b8,3);
  }
LAB_011a910c:
  if ((code *)local_78._M_allocated_capacity == (code *)0x0) {
    return iVar22;
  }
  (*(code *)local_78._M_allocated_capacity)(&local_88,&local_88,3);
  return iVar22;
}

Assistant:

static idx_t FindRangeBound(WindowCursor &range_lo, WindowCursor &range_hi, const idx_t order_begin,
                            const idx_t order_end, const WindowBoundary range, WindowInputExpression &boundary,
                            const idx_t chunk_idx, const FrameBounds &prev) {
	switch (boundary.InternalType()) {
	case PhysicalType::INT8:
		return FindTypedRangeBound<int8_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                             chunk_idx, prev);
	case PhysicalType::INT16:
		return FindTypedRangeBound<int16_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::INT32:
		return FindTypedRangeBound<int32_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::INT64:
		return FindTypedRangeBound<int64_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::UINT8:
		return FindTypedRangeBound<uint8_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                              chunk_idx, prev);
	case PhysicalType::UINT16:
		return FindTypedRangeBound<uint16_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                               chunk_idx, prev);
	case PhysicalType::UINT32:
		return FindTypedRangeBound<uint32_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                               chunk_idx, prev);
	case PhysicalType::UINT64:
		return FindTypedRangeBound<uint64_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                               chunk_idx, prev);
	case PhysicalType::INT128:
		return FindTypedRangeBound<hugeint_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                                chunk_idx, prev);
	case PhysicalType::UINT128:
		return FindTypedRangeBound<uhugeint_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                                 chunk_idx, prev);
	case PhysicalType::FLOAT:
		return FindTypedRangeBound<float, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                            chunk_idx, prev);
	case PhysicalType::DOUBLE:
		return FindTypedRangeBound<double, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                             chunk_idx, prev);
	case PhysicalType::INTERVAL:
		return FindTypedRangeBound<interval_t, OP, FROM>(range_lo, range_hi, order_begin, order_end, range, boundary,
		                                                 chunk_idx, prev);
	default:
		throw InternalException("Unsupported column type for RANGE");
	}
}